

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_foreign_key_constraint.hpp
# Opt level: O3

void __thiscall
duckdb::BoundForeignKeyConstraint::BoundForeignKeyConstraint
          (BoundForeignKeyConstraint *this,ForeignKeyInfo *info_p,physical_index_set_t *pk_key_set_p
          ,physical_index_set_t *fk_key_set_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  pointer pPVar8;
  
  (this->super_BoundConstraint).type = FOREIGN_KEY;
  (this->super_BoundConstraint)._vptr_BoundConstraint =
       (_func_int **)&PTR__BoundForeignKeyConstraint_0244c420;
  (this->info).type = info_p->type;
  paVar1 = &(this->info).schema.field_2;
  (this->info).schema._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (info_p->schema)._M_dataplus._M_p;
  paVar2 = &(info_p->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar7 = *(undefined8 *)((long)&(info_p->schema).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->info).schema.field_2 + 8) = uVar7;
  }
  else {
    (this->info).schema._M_dataplus._M_p = pcVar3;
    (this->info).schema.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->info).schema._M_string_length = (info_p->schema)._M_string_length;
  (info_p->schema)._M_dataplus._M_p = (pointer)paVar2;
  (info_p->schema)._M_string_length = 0;
  (info_p->schema).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->info).table.field_2;
  (this->info).table._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (info_p->table)._M_dataplus._M_p;
  paVar2 = &(info_p->table).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar7 = *(undefined8 *)((long)&(info_p->table).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->info).table.field_2 + 8) = uVar7;
  }
  else {
    (this->info).table._M_dataplus._M_p = pcVar3;
    (this->info).table.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->info).table._M_string_length = (info_p->table)._M_string_length;
  (info_p->table)._M_dataplus._M_p = (pointer)paVar2;
  (info_p->table)._M_string_length = 0;
  (info_p->table).field_2._M_local_buf[0] = '\0';
  pPVar8 = (info_p->pk_keys).
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->info).pk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_start =
       (info_p->pk_keys).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
       .super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->info).pk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar8;
  (this->info).pk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (info_p->pk_keys).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
       .super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (info_p->pk_keys).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (info_p->pk_keys).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (info_p->pk_keys).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = *(undefined4 *)
           ((long)&(info_p->fk_keys).
                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4);
  uVar5 = *(undefined4 *)
           &(info_p->fk_keys).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = *(undefined4 *)
           ((long)&(info_p->fk_keys).
                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 4);
  *(undefined4 *)
   &(this->info).fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
    .super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
    super__Vector_impl_data._M_start =
       *(undefined4 *)
        &(info_p->fk_keys).
         super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
         super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
         super__Vector_impl_data._M_start;
  *(undefined4 *)
   ((long)&(this->info).fk_keys.
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_start + 4) = uVar4;
  *(undefined4 *)
   &(this->info).fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
    .super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = uVar5;
  *(undefined4 *)
   ((long)&(this->info).fk_keys.
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_finish + 4) = uVar6;
  (this->info).fk_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (info_p->fk_keys).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
       .super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (info_p->fk_keys).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (info_p->fk_keys).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (info_p->fk_keys).super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->pk_key_set)._M_h,pk_key_set_p);
  ::std::
  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->fk_key_set)._M_h,fk_key_set_p,fk_key_set_p);
  return;
}

Assistant:

BoundForeignKeyConstraint(ForeignKeyInfo info_p, physical_index_set_t pk_key_set_p,
	                          physical_index_set_t fk_key_set_p)
	    : BoundConstraint(ConstraintType::FOREIGN_KEY), info(std::move(info_p)), pk_key_set(std::move(pk_key_set_p)),
	      fk_key_set(std::move(fk_key_set_p)) {
#ifdef DEBUG
		D_ASSERT(info.pk_keys.size() == pk_key_set.size());
		for (auto &key : info.pk_keys) {
			D_ASSERT(pk_key_set.find(key) != pk_key_set.end());
		}
		D_ASSERT(info.fk_keys.size() == fk_key_set.size());
		for (auto &key : info.fk_keys) {
			D_ASSERT(fk_key_set.find(key) != fk_key_set.end());
		}
#endif
	}